

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O0

void amrex::average_down(MultiFab *S_fine,MultiFab *S_crse,int scomp,int ncomp,IntVect *ratio)

{
  int iVar1;
  bool bVar2;
  DistributionMapping *pDVar3;
  int in_ECX;
  int in_EDX;
  FabArrayBase *in_RSI;
  FabArrayBase *in_RDI;
  element_type *in_R8;
  int i_3;
  int j_3;
  int k_3;
  int n_3;
  Dim3 amrex_i_hi_3;
  Dim3 amrex_i_lo_3;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  Array4<const_double> *finearr_1;
  Array4<double> *crsearr_1;
  Box *bx_1;
  MFIter mfi_1;
  MultiFab crse_S_fine;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *finearr;
  Array4<double> *crsearr;
  Box *bx;
  MFIter mfi;
  BoxArray crse_S_fine_BA;
  bool is_cell_centered;
  int iref_1;
  int jref_1;
  int kref_1;
  Real c_1;
  int kk_1;
  int jj_1;
  int ii_1;
  Real volfrac_1;
  int facz_1;
  int facy_1;
  int facx_1;
  int iref;
  int jref;
  int kref;
  Real c;
  int kk;
  int jj;
  int ii;
  Real volfrac;
  int facz;
  int facy;
  int facx;
  FabArrayBase *in_stack_fffffffffffff478;
  FabArrayBase *in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff488;
  undefined4 in_stack_fffffffffffff48c;
  Periodicity *period;
  BoxArray *in_stack_fffffffffffff498;
  int in_stack_fffffffffffff4a0;
  undefined4 in_stack_fffffffffffff4a4;
  undefined1 do_tiling_;
  int iVar4;
  FabArrayBase *in_stack_fffffffffffff4a8;
  FabArray<amrex::FArrayBox> *src;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff4b0;
  BoxArray *in_stack_fffffffffffff4b8;
  CpOp op;
  MultiFab *this;
  undefined4 in_stack_fffffffffffff4c8;
  int iVar5;
  undefined4 in_stack_fffffffffffff4cc;
  uint uVar6;
  undefined4 in_stack_fffffffffffff4d0;
  int iVar7;
  undefined4 in_stack_fffffffffffff4d4;
  int iVar8;
  int in_stack_fffffffffffff4e0;
  undefined4 in_stack_fffffffffffff4e4;
  int local_ae8;
  int local_ae4;
  int local_ae0;
  int local_adc;
  long local_a98;
  long local_a90;
  long local_a88;
  long local_a80;
  int local_a78;
  int local_a74;
  int local_a70;
  long *local_a58;
  long local_a50 [8];
  long *local_a10;
  undefined1 local_a04 [132];
  undefined1 local_980 [8];
  FabArray<amrex::FArrayBox> local_978;
  int local_7d0;
  int local_7cc;
  int local_7c8;
  int local_7c4;
  undefined8 local_7c0;
  int local_7b8;
  undefined8 local_7ac;
  int local_7a4;
  _func_int **local_7a0;
  int local_798;
  _func_int **local_790;
  int local_788;
  int local_780;
  int local_77c;
  int local_778;
  int local_774;
  undefined8 local_770;
  int local_768;
  undefined8 local_75c;
  int local_754;
  pointer local_750;
  int local_748;
  pointer local_740;
  int local_738;
  long local_730;
  long local_728;
  long local_720;
  long local_718;
  int local_710;
  int local_70c;
  int local_708;
  long *local_6f0;
  long local_6e8 [8];
  long *local_6a8;
  FabFactory<amrex::FArrayBox> local_69c [3];
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> local_680;
  MFIter local_678;
  undefined1 local_608 [172];
  int local_55c;
  uint uStack_558;
  int local_554;
  _Bit_pointer local_550;
  int local_548;
  FBData<amrex::FArrayBox> *local_540;
  int local_534;
  int iStack_530;
  int local_52c;
  _func_int **local_528;
  int local_520;
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_518;
  int local_50c;
  int iStack_508;
  int local_504;
  pointer local_500;
  int local_4f8;
  _Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_4f0;
  int local_4e4;
  int iStack_4e0;
  int local_4dc;
  MultiArray4<const_double> local_4d8;
  int local_4d0;
  FBData<amrex::FArrayBox> *local_4c8;
  int local_4bc;
  int iStack_4b8;
  int local_4b4;
  Long local_4b0;
  int local_4a8;
  unique_ptr<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_4a0;
  int local_494;
  int iStack_490;
  int local_48c;
  undefined8 local_488;
  int local_480;
  FabFactory<amrex::FArrayBox> *local_478;
  int local_46c;
  int iStack_468;
  int local_464;
  undefined8 local_460;
  int local_458;
  FabFactory<amrex::FArrayBox> *local_450;
  int local_448;
  int iStack_444;
  int local_440;
  undefined4 local_43c;
  undefined1 *local_438;
  undefined4 local_42c;
  undefined1 *local_428;
  undefined4 local_41c;
  int *local_418;
  undefined4 local_40c;
  undefined1 *local_408;
  undefined4 local_3fc;
  undefined1 *local_3f8;
  undefined4 local_3ec;
  int *local_3e8;
  undefined4 local_3dc;
  int *local_3d8;
  undefined4 local_3cc;
  int *local_3c8;
  undefined4 local_3bc;
  int *local_3b8;
  undefined4 local_3ac;
  int *local_3a8;
  undefined4 local_39c;
  int *local_398;
  undefined4 local_38c;
  int *local_388;
  undefined4 local_37c;
  FabFactory<amrex::FArrayBox> *local_378;
  undefined4 local_36c;
  FabFactory<amrex::FArrayBox> *local_368;
  undefined4 local_35c;
  FabFactory<amrex::FArrayBox> *local_358;
  undefined4 local_34c;
  FabFactory<amrex::FArrayBox> *local_348;
  undefined4 local_33c;
  FabFactory<amrex::FArrayBox> *local_338;
  undefined4 local_32c;
  FabFactory<amrex::FArrayBox> *local_328;
  undefined4 local_31c;
  FBData<amrex::FArrayBox> *local_318;
  undefined4 local_30c;
  FBData<amrex::FArrayBox> *local_308;
  undefined4 local_2fc;
  FBData<amrex::FArrayBox> *local_2f8;
  undefined4 local_2ec;
  FBData<amrex::FArrayBox> *local_2e8;
  undefined4 local_2dc;
  FBData<amrex::FArrayBox> *local_2d8;
  undefined4 local_2cc;
  FBData<amrex::FArrayBox> *local_2c8;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  double local_2b0;
  int local_2a4;
  int local_2a0;
  int local_29c;
  double local_298;
  int local_28c;
  int local_288;
  int local_284;
  undefined4 local_274;
  long *local_270;
  long *local_268;
  int local_25c;
  int local_258;
  int local_254;
  int local_250;
  undefined4 local_24c;
  undefined4 local_23c;
  undefined4 local_22c;
  int local_21c;
  int local_218;
  int local_214;
  double local_210;
  int local_204;
  int local_200;
  int local_1fc;
  double local_1f8;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  long *local_1d0;
  long *local_1c8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  undefined4 local_1ac;
  undefined4 local_19c;
  undefined4 local_18c;
  undefined4 local_174;
  long *local_170;
  long *local_168;
  int local_15c;
  int local_158;
  uint local_154;
  int local_150;
  undefined4 local_14c;
  undefined4 local_13c;
  undefined4 local_12c;
  long *local_110;
  long *local_108;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  undefined4 local_ec;
  undefined4 local_dc;
  undefined4 local_cc;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  long *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  long *local_50;
  int local_48;
  int local_44;
  uint local_40;
  int local_3c;
  long *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  long *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  local_608._112_8_ = in_R8;
  local_608._120_4_ = in_ECX;
  local_608._124_4_ = in_EDX;
  local_608._128_8_ = in_RSI;
  local_608._136_8_ = in_RDI;
  local_608[0x6f] = FabArrayBase::is_cell_centered(in_stack_fffffffffffff478);
  FabArrayBase::boxArray((FabArrayBase *)local_608._136_8_);
  this = (MultiFab *)local_608;
  BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff480,(BoxArray *)in_stack_fffffffffffff478);
  BoxArray::coarsen((BoxArray *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                    (IntVect *)this);
  FabArrayBase::boxArray((FabArrayBase *)local_608._128_8_);
  bVar2 = BoxArray::operator==
                    ((BoxArray *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                     in_stack_fffffffffffff498);
  if (bVar2) {
    in_stack_fffffffffffff4b8 =
         (BoxArray *)FabArrayBase::DistributionMap((FabArrayBase *)local_608._136_8_);
    FabArrayBase::DistributionMap((FabArrayBase *)local_608._128_8_);
    bVar2 = DistributionMapping::operator==
                      ((DistributionMapping *)
                       CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                       (DistributionMapping *)in_stack_fffffffffffff498);
    do_tiling_ = (undefined1)((uint)in_stack_fffffffffffff4a4 >> 0x18);
    if (bVar2) {
      TilingIfNotGPU();
      MFIter::MFIter((MFIter *)local_608._128_8_,in_stack_fffffffffffff4a8,(bool)do_tiling_);
      while (bVar2 = MFIter::isValid(&local_678), bVar2) {
        MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0));
        local_680._M_head_impl = local_69c;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
                   (MFIter *)in_stack_fffffffffffff480);
        local_6a8 = local_6e8;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
                   (MFIter *)in_stack_fffffffffffff480);
        local_6f0 = &local_730;
        if ((local_608[0x6f] & 1) == 0) {
          local_518._M_t.
          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
               (__uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
                )(__uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
                  )local_680._M_head_impl;
          local_328 = local_680._M_head_impl;
          local_32c = 0;
          local_50c = *(int *)&(local_680._M_head_impl)->_vptr_FabFactory;
          local_338 = local_680._M_head_impl;
          local_33c = 1;
          iStack_508 = *(int *)((long)&(local_680._M_head_impl)->_vptr_FabFactory + 4);
          local_7a0 = (local_680._M_head_impl)->_vptr_FabFactory;
          local_348 = local_680._M_head_impl;
          local_34c = 2;
          local_798 = *(int *)&local_680._M_head_impl[1]._vptr_FabFactory;
          local_478 = local_680._M_head_impl;
          local_3e8 = (int *)((long)&local_680._M_head_impl[1]._vptr_FabFactory + 4);
          local_3ec = 0;
          local_46c = *local_3e8;
          local_3f8 = (undefined1 *)((long)&local_680._M_head_impl[1]._vptr_FabFactory + 4);
          local_3fc = 1;
          iStack_468 = *(int *)&local_680._M_head_impl[2]._vptr_FabFactory;
          local_7c0 = *(undefined8 *)local_3e8;
          local_408 = (undefined1 *)((long)&local_680._M_head_impl[1]._vptr_FabFactory + 4);
          local_40c = 2;
          local_7b8 = *(int *)((long)&local_680._M_head_impl[2]._vptr_FabFactory + 4);
          for (local_7c4 = 0; iVar4 = local_798, local_7ac = local_7c0, local_7a4 = local_7b8,
              local_790 = local_7a0, local_788 = local_798, local_528 = local_7a0,
              local_520 = local_798, local_504 = local_798, local_488 = local_7c0,
              local_480 = local_7b8, local_464 = local_7b8, local_7c4 < (int)local_608._120_4_;
              local_7c4 = local_7c4 + 1) {
            while (local_7c8 = iVar4, iVar4 = iStack_508, local_7c8 <= local_7b8) {
              while (local_7cc = iVar4, iVar4 = local_50c, local_7cc <= iStack_468) {
                while (local_7d0 = iVar4, local_7d0 <= local_46c) {
                  local_f0 = local_7d0;
                  local_f4 = local_7cc;
                  local_f8 = local_7c8;
                  local_fc = local_7c4;
                  local_108 = local_6a8;
                  local_cc = 0;
                  local_b4 = local_7d0 *
                             *(int *)&(((Vector<int,_std::allocator<int>_> *)local_608._112_8_)->
                                      super_vector<int,_std::allocator<int>_>).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start;
                  local_dc = 1;
                  local_b8 = local_7cc *
                             *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                              local_608._112_8_)->
                                             super_vector<int,_std::allocator<int>_>).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start + 4);
                  local_ec = 2;
                  local_bc = local_7c8 *
                             *(int *)&(((Vector<int,_std::allocator<int>_> *)local_608._112_8_)->
                                      super_vector<int,_std::allocator<int>_>).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish;
                  local_c0 = local_7c4 + local_608._124_4_;
                  local_50 = local_6a8;
                  local_54 = local_7d0;
                  local_58 = local_7cc;
                  local_5c = local_7c8;
                  local_60 = local_7c4 + local_608._124_4_;
                  *(undefined8 *)
                   (*local_6a8 +
                   ((long)(local_7d0 - (int)local_6a8[4]) +
                    (long)(local_7cc - *(int *)((long)local_6a8 + 0x24)) * local_6a8[1] +
                    (long)(local_7c8 - (int)local_6a8[5]) * local_6a8[2] +
                   (long)local_60 * local_6a8[3]) * 8) =
                       *(undefined8 *)
                        (local_730 +
                        ((long)(local_b4 - local_710) + (local_b8 - local_70c) * local_728 +
                         (local_bc - local_708) * local_720 + local_c0 * local_718) * 8);
                  local_110 = local_6f0;
                  local_b0 = local_6f0;
                  iVar4 = local_7d0 + 1;
                }
                iVar4 = local_7cc + 1;
              }
              iVar4 = local_7c8 + 1;
            }
          }
        }
        else {
          local_4f0.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl
               = (_Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>)
                 (_Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>)
                 local_680._M_head_impl;
          local_358 = local_680._M_head_impl;
          local_35c = 0;
          local_4e4 = *(int *)&(local_680._M_head_impl)->_vptr_FabFactory;
          local_368 = local_680._M_head_impl;
          local_36c = 1;
          iStack_4e0 = *(int *)((long)&(local_680._M_head_impl)->_vptr_FabFactory + 4);
          local_750 = (pointer)(local_680._M_head_impl)->_vptr_FabFactory;
          local_378 = local_680._M_head_impl;
          local_37c = 2;
          local_748 = *(int *)&local_680._M_head_impl[1]._vptr_FabFactory;
          local_450 = local_680._M_head_impl;
          local_418 = (int *)((long)&local_680._M_head_impl[1]._vptr_FabFactory + 4);
          local_41c = 0;
          local_448 = *local_418;
          local_428 = (undefined1 *)((long)&local_680._M_head_impl[1]._vptr_FabFactory + 4);
          local_42c = 1;
          iStack_444 = *(int *)&local_680._M_head_impl[2]._vptr_FabFactory;
          local_770 = *(undefined8 *)local_418;
          local_438 = (undefined1 *)((long)&local_680._M_head_impl[1]._vptr_FabFactory + 4);
          local_43c = 2;
          local_768 = *(int *)((long)&local_680._M_head_impl[2]._vptr_FabFactory + 4);
          for (local_774 = 0; iVar4 = local_748, local_75c = local_770, local_754 = local_768,
              local_740 = local_750, local_738 = local_748, local_500 = local_750,
              local_4f8 = local_748, local_4dc = local_748, local_460 = local_770,
              local_458 = local_768, local_440 = local_768, local_774 < (int)local_608._120_4_;
              local_774 = local_774 + 1) {
            while (local_778 = iVar4, iVar4 = iStack_4e0, local_778 <= local_768) {
              while (local_77c = iVar4, iVar4 = local_4e4, local_77c <= iStack_444) {
                while (local_780 = iVar4, local_780 <= local_448) {
                  local_1b0 = local_780;
                  local_1b4 = local_77c;
                  local_1b8 = local_778;
                  local_1bc = local_774;
                  local_1c8 = local_6a8;
                  local_18c = 0;
                  local_1e4 = *(int *)&(((Vector<int,_std::allocator<int>_> *)local_608._112_8_)->
                                       super_vector<int,_std::allocator<int>_>).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start;
                  local_19c = 1;
                  local_1e8 = *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                               local_608._112_8_)->
                                              super_vector<int,_std::allocator<int>_>).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start + 4);
                  local_1ac = 2;
                  local_1ec = *(int *)&(((Vector<int,_std::allocator<int>_> *)local_608._112_8_)->
                                       super_vector<int,_std::allocator<int>_>).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish;
                  local_1f8 = 1.0 / (double)(local_1e4 * local_1e8 * local_1ec);
                  local_1fc = local_780 * local_1e4;
                  local_200 = local_77c * local_1e8;
                  local_204 = local_778 * local_1ec;
                  local_210 = 0.0;
                  for (local_214 = 0; local_214 < local_1ec; local_214 = local_214 + 1) {
                    for (local_218 = 0; local_218 < local_1e8; local_218 = local_218 + 1) {
                      for (local_21c = 0; local_21c < local_1e4; local_21c = local_21c + 1) {
                        local_84 = local_1fc + local_21c;
                        local_88 = local_200 + local_218;
                        local_8c = local_204 + local_214;
                        local_90 = local_774 + local_608._124_4_;
                        local_210 = *(double *)
                                     (local_730 +
                                     ((long)(local_84 - local_710) +
                                      (local_88 - local_70c) * local_728 +
                                      (local_8c - local_708) * local_720 + local_90 * local_718) * 8
                                     ) + local_210;
                        local_80 = local_6f0;
                      }
                    }
                  }
                  local_20 = local_6a8;
                  local_24 = local_780;
                  local_28 = local_77c;
                  local_2c = local_778;
                  local_30 = local_774 + local_608._124_4_;
                  *(double *)
                   (*local_6a8 +
                   ((long)(local_780 - (int)local_6a8[4]) +
                    (long)(local_77c - *(int *)((long)local_6a8 + 0x24)) * local_6a8[1] +
                    (long)(local_778 - (int)local_6a8[5]) * local_6a8[2] +
                   (long)local_30 * local_6a8[3]) * 8) = local_1f8 * local_210;
                  local_1d0 = local_6f0;
                  iVar4 = local_780 + 1;
                }
                iVar4 = local_77c + 1;
              }
              iVar4 = local_778 + 1;
            }
          }
        }
        MFIter::operator++(&local_678);
      }
      MFIter::~MFIter((MFIter *)in_stack_fffffffffffff480);
      local_608._128_8_ = in_stack_fffffffffffff480;
      goto LAB_0103af9d;
    }
  }
  pDVar3 = FabArrayBase::DistributionMap((FabArrayBase *)local_608._136_8_);
  local_978.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
  local_978.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
  local_978.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
  local_978.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
  local_978.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
  src = &local_978;
  iVar4 = local_608._120_4_;
  MFInfo::MFInfo((MFInfo *)0x103a1b9);
  local_980._0_4_ = 0;
  local_980._4_4_ = 0;
  period = (Periodicity *)local_980;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff480);
  MultiFab::MultiFab(this,in_stack_fffffffffffff4b8,(DistributionMapping *)in_stack_fffffffffffff4b0
                     ,(int)((ulong)src >> 0x20),(int)src,
                     (MFInfo *)CONCAT44(iVar4,in_stack_fffffffffffff4a0),
                     (FabFactory<amrex::FArrayBox> *)
                     CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x103a217);
  MFInfo::~MFInfo((MFInfo *)0x103a224);
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)in_stack_fffffffffffff4b0,&src->super_FabArrayBase,
                 SUB41((uint)iVar4 >> 0x18,0));
  while( true ) {
    bVar2 = MFIter::isValid((MFIter *)(local_a04 + 0x24));
    op = (CpOp)this;
    iVar8 = (int)((ulong)pDVar3 >> 0x20);
    if (!bVar2) break;
    MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0));
    local_a04._28_8_ = local_a04;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
               (MFIter *)in_stack_fffffffffffff480);
    local_a10 = local_a50;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
               (MFIter *)in_stack_fffffffffffff480);
    local_a58 = &local_a98;
    if ((local_608[0x6f] & 1) == 0) {
      local_608._160_8_ = local_a04._28_8_;
      local_2c8 = (FBData<amrex::FArrayBox> *)local_a04._28_8_;
      local_2cc = 0;
      local_55c = *(int *)(_Alloc_hider *)local_a04._28_8_;
      local_2d8 = (FBData<amrex::FArrayBox> *)local_a04._28_8_;
      local_2dc = 1;
      uStack_558 = *(uint *)((_Alloc_hider *)local_a04._28_8_ + 4);
      local_608._144_8_ = *(undefined8 *)(_Alloc_hider *)local_a04._28_8_;
      local_2e8 = (FBData<amrex::FArrayBox> *)local_a04._28_8_;
      local_2ec = 2;
      local_608._152_4_ = (undefined4)*(size_type *)(local_a04._28_8_ + 8);
      local_4c8 = (FBData<amrex::FArrayBox> *)local_a04._28_8_;
      local_388 = (int *)(local_a04._28_8_ + 0xc);
      local_38c = 0;
      local_4bc = *local_388;
      local_398 = (int *)(local_a04._28_8_ + 0xc);
      local_39c = 1;
      iStack_4b8 = *(int *)(local_a04._28_8_ + 0x10);
      local_4d8.hp = *(Array4<const_double> **)local_388;
      local_3a8 = (int *)(local_a04._28_8_ + 0xc);
      local_3ac = 2;
      in_stack_fffffffffffff4e0 = *(int *)((long)(local_a04._28_8_ + 0x10) + 4);
      for (iVar8 = 0; iVar7 = local_608._152_4_, local_554 = local_608._152_4_,
          local_4d0 = in_stack_fffffffffffff4e0, local_4b4 = in_stack_fffffffffffff4e0,
          iVar8 < (int)local_608._120_4_; iVar8 = iVar8 + 1) {
        for (; uVar6 = uStack_558, iVar7 <= in_stack_fffffffffffff4e0; iVar7 = iVar7 + 1) {
          for (; iVar1 = local_55c, (int)uVar6 <= iStack_4b8; uVar6 = uVar6 + 1) {
            while (iVar5 = iVar1, iVar5 <= local_4bc) {
              local_168 = local_a10;
              local_174 = 0;
              local_12c = 0;
              local_9c = iVar5 * *(int *)&(((Vector<int,_std::allocator<int>_> *)local_608._112_8_)
                                          ->super_vector<int,_std::allocator<int>_>).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start;
              local_13c = 1;
              local_a0 = uVar6 * *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                                  local_608._112_8_)->
                                                 super_vector<int,_std::allocator<int>_>).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + 4);
              local_14c = 2;
              local_a4 = iVar7 * *(int *)&(((Vector<int,_std::allocator<int>_> *)local_608._112_8_)
                                          ->super_vector<int,_std::allocator<int>_>).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish;
              local_a8 = iVar8 + local_608._124_4_;
              local_38 = local_a10;
              *(undefined8 *)
               (*local_a10 +
               ((long)(iVar5 - (int)local_a10[4]) +
                (long)(int)(uVar6 - *(int *)((long)local_a10 + 0x24)) * local_a10[1] +
                (long)(iVar7 - (int)local_a10[5]) * local_a10[2] + (long)iVar8 * local_a10[3]) * 8)
                   = *(undefined8 *)
                      (local_a98 +
                      ((long)(local_9c - local_a78) + (local_a0 - local_a74) * local_a90 +
                       (local_a4 - local_a70) * local_a88 + local_a8 * local_a80) * 8);
              local_170 = local_a58;
              local_15c = iVar8;
              local_158 = iVar7;
              local_154 = uVar6;
              local_150 = iVar5;
              local_98 = local_a58;
              local_48 = iVar8;
              local_44 = iVar7;
              local_40 = uVar6;
              local_3c = iVar5;
              iVar1 = iVar5 + 1;
            }
          }
        }
      }
    }
    else {
      local_540 = (FBData<amrex::FArrayBox> *)local_a04._28_8_;
      local_2f8 = (FBData<amrex::FArrayBox> *)local_a04._28_8_;
      local_2fc = 0;
      local_534 = *(int *)(_Alloc_hider *)local_a04._28_8_;
      local_308 = (FBData<amrex::FArrayBox> *)local_a04._28_8_;
      local_30c = 1;
      iStack_530 = *(int *)((_Alloc_hider *)local_a04._28_8_ + 4);
      local_550 = *(_Bit_pointer *)(_Alloc_hider *)local_a04._28_8_;
      local_318 = (FBData<amrex::FArrayBox> *)local_a04._28_8_;
      local_31c = 2;
      local_548 = (int)*(size_type *)(local_a04._28_8_ + 8);
      local_4a0._M_t.
      super___uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
      .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
            )(__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
              )local_a04._28_8_;
      local_3b8 = (int *)(local_a04._28_8_ + 0xc);
      local_3bc = 0;
      local_494 = *local_3b8;
      local_3c8 = (int *)(local_a04._28_8_ + 0xc);
      local_3cc = 1;
      iStack_490 = *(int *)(local_a04._28_8_ + 0x10);
      local_4b0 = *(Long *)local_3b8;
      local_3d8 = (int *)(local_a04._28_8_ + 0xc);
      local_3dc = 2;
      local_4a8 = *(int *)((long)(local_a04._28_8_ + 0x10) + 4);
      for (local_adc = 0; local_ae0 = local_548, local_52c = local_548, local_48c = local_4a8,
          local_adc < (int)local_608._120_4_; local_adc = local_adc + 1) {
        for (; local_ae4 = iStack_530, local_ae0 <= local_4a8; local_ae0 = local_ae0 + 1) {
          for (; local_ae8 = local_534, local_ae4 <= iStack_490; local_ae4 = local_ae4 + 1) {
            for (; local_ae8 <= local_494; local_ae8 = local_ae8 + 1) {
              local_250 = local_ae8;
              local_254 = local_ae4;
              local_258 = local_ae0;
              local_25c = local_adc;
              local_268 = local_a10;
              local_274 = 0;
              local_22c = 0;
              local_284 = *(int *)&(((Vector<int,_std::allocator<int>_> *)local_608._112_8_)->
                                   super_vector<int,_std::allocator<int>_>).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start;
              local_23c = 1;
              local_288 = *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)local_608._112_8_)
                                          ->super_vector<int,_std::allocator<int>_>).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start + 4);
              local_24c = 2;
              local_28c = *(int *)&(((Vector<int,_std::allocator<int>_> *)local_608._112_8_)->
                                   super_vector<int,_std::allocator<int>_>).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish;
              local_298 = 1.0 / (double)(local_284 * local_288 * local_28c);
              local_29c = local_ae8 * local_284;
              local_2a0 = local_ae4 * local_288;
              local_2a4 = local_ae0 * local_28c;
              local_2b0 = 0.0;
              for (local_2b4 = 0; local_2b4 < local_28c; local_2b4 = local_2b4 + 1) {
                for (local_2b8 = 0; local_2b8 < local_288; local_2b8 = local_2b8 + 1) {
                  for (local_2bc = 0; local_2bc < local_284; local_2bc = local_2bc + 1) {
                    local_6c = local_29c + local_2bc;
                    local_70 = local_2a0 + local_2b8;
                    local_74 = local_2a4 + local_2b4;
                    local_78 = local_adc + local_608._124_4_;
                    local_2b0 = *(double *)
                                 (local_a98 +
                                 ((long)(local_6c - local_a78) + (local_70 - local_a74) * local_a90
                                  + (local_74 - local_a70) * local_a88 + local_78 * local_a80) * 8)
                                + local_2b0;
                    local_68 = local_a58;
                  }
                }
              }
              local_8 = local_a10;
              local_c = local_ae8;
              local_10 = local_ae4;
              local_14 = local_ae0;
              local_18 = local_adc;
              *(double *)
               (*local_a10 +
               ((long)(local_ae8 - (int)local_a10[4]) +
                (long)(local_ae4 - *(int *)((long)local_a10 + 0x24)) * local_a10[1] +
                (long)(local_ae0 - (int)local_a10[5]) * local_a10[2] +
               (long)local_adc * local_a10[3]) * 8) = local_298 * local_2b0;
              local_270 = local_a58;
            }
          }
        }
      }
    }
    MFIter::operator++((MFIter *)(local_a04 + 0x24));
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffff480);
  Periodicity::NonPeriodic();
  FabArray<amrex::FArrayBox>::ParallelCopy
            (in_stack_fffffffffffff4b0,src,iVar4,in_stack_fffffffffffff4a0,iVar8,period,op);
  MultiFab::~MultiFab((MultiFab *)0x103af9d);
LAB_0103af9d:
  BoxArray::~BoxArray((BoxArray *)local_608._128_8_);
  return;
}

Assistant:

void average_down (const MultiFab& S_fine, MultiFab& S_crse,
                       int scomp, int ncomp, const IntVect& ratio)
    {
        BL_PROFILE("amrex::average_down");
        AMREX_ASSERT(S_crse.nComp() == S_fine.nComp());
        AMREX_ASSERT((S_crse.is_cell_centered() && S_fine.is_cell_centered()) ||
                     (S_crse.is_nodal()         && S_fine.is_nodal()));

        bool is_cell_centered = S_crse.is_cell_centered();

        //
        // Coarsen() the fine stuff on processors owning the fine data.
        //
        BoxArray crse_S_fine_BA = S_fine.boxArray(); crse_S_fine_BA.coarsen(ratio);

        if (crse_S_fine_BA == S_crse.boxArray() && S_fine.DistributionMap() == S_crse.DistributionMap())
        {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && S_crse.isFusingCandidate()) {
                auto const& crsema = S_crse.arrays();
                auto const& finema = S_fine.const_arrays();
                if (is_cell_centered) {
                    ParallelFor(S_crse, IntVect(0), ncomp,
                    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                    {
                        amrex_avgdown(i,j,k,n,crsema[box_no],finema[box_no],scomp,scomp,ratio);
                    });
                } else {
                    ParallelFor(S_crse, IntVect(0), ncomp,
                    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                    {
                        amrex_avgdown_nodes(i,j,k,n,crsema[box_no],finema[box_no],scomp,scomp,ratio);
                    });
                }
                Gpu::streamSynchronize();
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(S_crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    //  NOTE: The tilebox is defined at the coarse level.
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& crsearr = S_crse.array(mfi);
                    Array4<Real const> const& finearr = S_fine.const_array(mfi);

                    if (is_cell_centered) {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                        {
                            amrex_avgdown(i,j,k,n,crsearr,finearr,scomp,scomp,ratio);
                        });
                    } else {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                        {
                            amrex_avgdown_nodes(i,j,k,n,crsearr,finearr,scomp,scomp,ratio);
                        });
                    }
                }
            }
        }
        else
        {
            MultiFab crse_S_fine(crse_S_fine_BA, S_fine.DistributionMap(), ncomp, 0, MFInfo(), FArrayBoxFactory());

#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && crse_S_fine.isFusingCandidate()) {
                auto const& crsema = crse_S_fine.arrays();
                auto const& finema = S_fine.const_arrays();
                if (is_cell_centered) {
                    ParallelFor(crse_S_fine, IntVect(0), ncomp,
                    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                    {
                        amrex_avgdown(i,j,k,n,crsema[box_no],finema[box_no],0,scomp,ratio);
                    });
                } else {
                    ParallelFor(crse_S_fine, IntVect(0), ncomp,
                    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                    {
                        amrex_avgdown_nodes(i,j,k,n,crsema[box_no],finema[box_no],0,scomp,ratio);
                    });
                }
                Gpu::streamSynchronize();
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(crse_S_fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    //  NOTE: The tilebox is defined at the coarse level.
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& crsearr = crse_S_fine.array(mfi);
                    Array4<Real const> const& finearr = S_fine.const_array(mfi);

                    //  NOTE: We copy from component scomp of the fine fab into component 0 of the crse fab
                    //        because the crse fab is a temporary which was made starting at comp 0, it is
                    //        not part of the actual crse multifab which came in.

                    if (is_cell_centered) {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                        {
                            amrex_avgdown(i,j,k,n,crsearr,finearr,0,scomp,ratio);
                        });
                    } else {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                        {
                            amrex_avgdown_nodes(i,j,k,n,crsearr,finearr,0,scomp,ratio);
                        });
                    }
                }
            }

            S_crse.ParallelCopy(crse_S_fine,0,scomp,ncomp);
        }
   }